

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O3

void __thiscall webrtc::WavWriter::WriteSamples(WavWriter *this,int16_t *samples,size_t num_samples)

{
  size_t *psVar1;
  ulong uVar2;
  string *result;
  ostream *poVar3;
  size_t written;
  size_t local_198;
  size_t local_190;
  FatalMessage local_188;
  
  local_190 = num_samples;
  local_198 = fwrite(samples,2,num_samples,(FILE *)this->file_handle_);
  if ((local_198 != num_samples) &&
     (result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                         (&local_190,&local_198,"num_samples == written"), num_samples = local_198,
     result != (string *)0x0)) {
    rtc::FatalMessage::FatalMessage
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
               ,0x97,result);
    rtc::FatalMessage::~FatalMessage(&local_188);
  }
  psVar1 = &this->num_samples_;
  uVar2 = *psVar1;
  *psVar1 = *psVar1 + num_samples;
  if (CARRY8(uVar2,num_samples)) {
    rtc::FatalMessage::FatalMessage
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
               ,0x99);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_188,"Check failed: num_samples_ >= written",0x25);
    std::ios::widen((char)(ostream *)&local_188 + (char)*(undefined8 *)(local_188._0_8_ + -0x18));
    std::ostream::put((char)&local_188);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"# ",2);
    rtc::FatalMessage::~FatalMessage(&local_188);
  }
  return;
}

Assistant:

void WavWriter::WriteSamples(const int16_t* samples, size_t num_samples) {
#ifndef WEBRTC_ARCH_LITTLE_ENDIAN
#error "Need to convert samples to little-endian when writing to WAV file"
#endif
  const size_t written =
      fwrite(samples, sizeof(*samples), num_samples, file_handle_);
  RTC_CHECK_EQ(num_samples, written);
  num_samples_ += written;
  RTC_CHECK(num_samples_ >= written);  // detect size_t overflow
}